

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O0

void __thiscall density::lifo_array<MyStruct>::lifo_array(lifo_array<MyStruct> *this,size_t i_size)

{
  size_t i_size_local;
  lifo_array<MyStruct> *this_local;
  
  detail::LifoArrayImpl<MyStruct,_false>::LifoArrayImpl
            (&this->super_LifoArrayImpl<MyStruct,_false>,i_size);
  default_construct(this);
  return;
}

Assistant:

lifo_array(size_t i_size) : detail::LifoArrayImpl<TYPE>(i_size)
        {
            default_construct(std::is_pod<TYPE>());
        }